

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

void sqlcheck::CheckPrimaryKeyExists
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  bool bVar1;
  string title;
  string local_90;
  string local_70;
  regex pattern;
  
  bVar1 = IsCreateStatement(sql_statement);
  if (bVar1) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern,"(primary key)",0x10);
    title._M_dataplus._M_p = (pointer)&title.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&title,"Primary Key Does Not Exist","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,title._M_dataplus._M_p,
               title._M_dataplus._M_p + title._M_string_length);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,anon_var_dwarf_d01a4,anon_var_dwarf_d01a4 + 0x1ca);
    CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_MEDIUM,
                 PATTERN_TYPE_LOGICAL_DATABASE_DESIGN,&local_90,&local_70,false,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)title._M_dataplus._M_p != &title.field_2) {
      operator_delete(title._M_dataplus._M_p);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  }
  return;
}

Assistant:

void CheckPrimaryKeyExists(Configuration& state,
                           const std::string& sql_statement,
                           bool& print_statement){

  auto create_statement = IsCreateStatement(sql_statement);
  if(create_statement == false){
    return;
  }

  std::regex pattern("(primary key)");
  std::string title = "Primary Key Does Not Exist";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  auto message =
      "● Consider adding a primary key:  "
      "A primary key constraint is important when you need to do the following:  "
      "prevent a table from containing duplicate rows, "
      "reference individual rows in queries, and "
      "support foreign key references "
      "If you don’t use primary key constraints, you create a chore for yourself:  "
      "checking for duplicate rows. More often than not, you will need to define "
      "a primary key for every table. Use compound keys when they are appropriate.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_MEDIUM,
               pattern_type,
               title,
               message,
               false);

}